

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digit_comparison.h
# Opt level: O0

void fast_float::parse_mantissa<char>
               (bigint *result,parsed_number_string_t<char> *num,size_t max_digits,size_t *digits)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  bigint *pbVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  difference_type dVar7;
  uint64_t uVar8;
  ulong uVar9;
  bigint *pbVar10;
  bool bVar11;
  bool truncated_1;
  bool local_2a9;
  bool truncated;
  char *pend;
  char *p;
  size_t step;
  limb value;
  size_t counter;
  size_t *digits_local;
  size_t max_digits_local;
  parsed_number_string_t<char> *num_local;
  bigint *result_local;
  uint64_t val_4;
  char **local_250;
  uint64_t local_248;
  uint64_t val;
  char **local_238;
  size_t local_230;
  limb *local_228;
  size_t *local_220;
  char **local_218;
  size_t local_210;
  limb *local_208;
  size_t *local_200;
  char **local_1f8;
  size_t local_1f0;
  limb *local_1e8;
  size_t *local_1e0;
  char **local_1d8;
  size_t local_1d0;
  limb *local_1c8;
  size_t *local_1c0;
  char **local_1b8;
  size_t local_1b0;
  limb local_1a8;
  parsed_number_string_t<char> *local_1a0;
  size_t local_198;
  limb local_190;
  parsed_number_string_t<char> *local_188;
  size_t local_180;
  limb local_178;
  parsed_number_string_t<char> *local_170;
  size_t local_168;
  limb local_160;
  parsed_number_string_t<char> *local_158;
  size_t local_150;
  limb local_148;
  parsed_number_string_t<char> *local_140;
  uint64_t local_138;
  uint64_t val_6;
  uint64_t *local_128;
  char local_119;
  uint64_t local_118;
  uint64_t val_2;
  uint64_t *local_108;
  bool local_f9;
  span<const_char> local_f8;
  uint64_t local_e8;
  uint64_t val_3;
  uint64_t *local_d8;
  char local_c9;
  long *local_c8;
  parsed_number_string_t<char> *local_c0;
  limb local_b8;
  undefined8 local_b0;
  parsed_number_string_t<char> *local_a8;
  long *local_a0;
  parsed_number_string_t<char> *local_98;
  limb local_90;
  undefined8 local_88;
  parsed_number_string_t<char> *local_80;
  char *local_78;
  long local_70;
  uint64_t val_1;
  undefined8 local_60;
  uint64_t mul2;
  uint64_t mul1;
  uint64_t mask;
  char *local_40;
  long local_38;
  uint64_t val_5;
  undefined8 local_28;
  uint64_t mul2_1;
  uint64_t mul1_1;
  uint64_t mask_1;
  
  value = 0;
  *digits = 0;
  step = 0;
  p = (char *)0x13;
  pcVar6 = (num->integer).ptr;
  pend = pcVar6;
  counter = (size_t)digits;
  digits_local = (size_t *)max_digits;
  max_digits_local = (size_t)num;
  num_local = (parsed_number_string_t<char> *)result;
  sVar5 = span<const_char>::len(&num->integer);
  pcVar6 = pcVar6 + sVar5;
  local_238 = &pend;
  val = (uint64_t)pcVar6;
  while( true ) {
    dVar7 = std::distance<char_const*>(*local_238,(char *)val);
    iVar4 = int_cmp_len<char>();
    if (dVar7 < iVar4) break;
    uVar1 = *(uint64_t *)*local_238;
    local_248 = uVar1;
    uVar8 = int_cmp_zeros<char>();
    if (uVar1 != uVar8) break;
    iVar4 = int_cmp_len<char>();
    *local_238 = *local_238 + iVar4;
  }
  while ((*local_238 != (char *)val && (**local_238 == '0'))) {
    *local_238 = *local_238 + 1;
  }
  while (pend != pcVar6) {
    while( true ) {
      dVar7 = std::distance<char_const*>(pend,pcVar6);
      bVar11 = false;
      if ((7 < dVar7) && (bVar11 = false, 7 < (long)p - value)) {
        bVar11 = 7 < (ulong)((long)digits_local - *(long *)counter);
      }
      if (!bVar11) break;
      local_1f8 = &pend;
      local_200 = &step;
      local_208 = &value;
      local_210 = counter;
      local_78 = pend;
      local_70 = *(long *)pend;
      mul1 = 0xff000000ff;
      mul2 = 0xf424000000064;
      local_60 = 0x271000000001;
      uVar9 = (local_70 + 0xcfcfcfcfcfcfcfd0U) * 10 + (local_70 + 0xcfcfcfcfcfcfcfd0U >> 8);
      mask = (uVar9 & 0xff000000ff) * 0xf424000000064 +
             (uVar9 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20;
      step = step * 100000000 + mask;
      pend = pend + 8;
      value = value + 8;
      *(long *)counter = *(long *)counter + 8;
      val_1 = (uint64_t)local_78;
    }
    while( true ) {
      bVar11 = false;
      if ((value < p) && (bVar11 = false, pend != pcVar6)) {
        bVar11 = *(size_t **)counter < digits_local;
      }
      if (!bVar11) break;
      local_1b8 = &pend;
      local_1c0 = &step;
      local_1c8 = &value;
      local_1d0 = counter;
      step = step * 10 + (long)(*pend + -0x30);
      pend = pend + 1;
      value = value + 1;
      *(long *)counter = *(long *)counter + 1;
    }
    if (*(size_t **)counter == digits_local) {
      local_148 = *(limb *)(powers_of_ten_uint64 + value * 8);
      local_140 = num_local;
      local_150 = step;
      bigint::mul((bigint *)num_local,local_148);
      bigint::add((bigint *)local_140,local_150);
      local_108 = (uint64_t *)pend;
      val_2 = (uint64_t)pcVar6;
      goto LAB_00679eeb;
    }
    local_160 = *(limb *)(powers_of_ten_uint64 + value * 8);
    local_158 = num_local;
    local_168 = step;
    bigint::mul((bigint *)num_local,local_160);
    bigint::add((bigint *)local_158,local_168);
    value = 0;
    step = 0;
  }
  if (*(long *)(max_digits_local + 0x30) != 0) {
    pcVar6 = *(char **)(max_digits_local + 0x30);
    pend = pcVar6;
    sVar5 = span<const_char>::len((span<const_char> *)(max_digits_local + 0x30));
    pcVar6 = pcVar6 + sVar5;
    if (*(long *)counter == 0) {
      local_250 = &pend;
      val_4 = (uint64_t)pcVar6;
      while( true ) {
        dVar7 = std::distance<char_const*>(*local_250,(char *)val_4);
        iVar4 = int_cmp_len<char>();
        if (dVar7 < iVar4) break;
        pbVar3 = *(bigint **)*local_250;
        result_local = pbVar3;
        pbVar10 = (bigint *)int_cmp_zeros<char>();
        if (pbVar3 != pbVar10) break;
        iVar4 = int_cmp_len<char>();
        *local_250 = *local_250 + iVar4;
      }
      while ((*local_250 != (char *)val_4 && (**local_250 == '0'))) {
        *local_250 = *local_250 + 1;
      }
    }
    while (pend != pcVar6) {
      while( true ) {
        dVar7 = std::distance<char_const*>(pend,pcVar6);
        bVar11 = false;
        if ((7 < dVar7) && (bVar11 = false, 7 < (long)p - value)) {
          bVar11 = 7 < (ulong)((long)digits_local - *(long *)counter);
        }
        if (!bVar11) break;
        local_218 = &pend;
        local_220 = &step;
        local_228 = &value;
        local_230 = counter;
        local_40 = pend;
        local_38 = *(long *)pend;
        mul1_1 = 0xff000000ff;
        mul2_1 = 0xf424000000064;
        local_28 = 0x271000000001;
        uVar9 = (local_38 + 0xcfcfcfcfcfcfcfd0U) * 10 + (local_38 + 0xcfcfcfcfcfcfcfd0U >> 8);
        mask_1 = (uVar9 & 0xff000000ff) * 0xf424000000064 +
                 (uVar9 >> 0x10 & 0xff000000ff) * 0x271000000001 >> 0x20;
        step = step * 100000000 + mask_1;
        pend = pend + 8;
        value = value + 8;
        *(long *)counter = *(long *)counter + 8;
        val_5 = (uint64_t)local_40;
      }
      while( true ) {
        bVar11 = false;
        if ((value < p) && (bVar11 = false, pend != pcVar6)) {
          bVar11 = *(size_t **)counter < digits_local;
        }
        if (!bVar11) break;
        local_1d8 = &pend;
        local_1e0 = &step;
        local_1e8 = &value;
        local_1f0 = counter;
        step = step * 10 + (long)(*pend + -0x30);
        pend = pend + 1;
        value = value + 1;
        *(long *)counter = *(long *)counter + 1;
      }
      if (*(size_t **)counter == digits_local) {
        local_178 = *(limb *)(powers_of_ten_uint64 + value * 8);
        local_170 = num_local;
        local_180 = step;
        bigint::mul((bigint *)num_local,local_178);
        bigint::add((bigint *)local_170,local_180);
        local_128 = (uint64_t *)pend;
        val_6 = (uint64_t)pcVar6;
        goto LAB_0067a6ec;
      }
      local_190 = *(limb *)(powers_of_ten_uint64 + value * 8);
      local_188 = num_local;
      local_198 = step;
      bigint::mul((bigint *)num_local,local_190);
      bigint::add((bigint *)local_188,local_198);
      value = 0;
      step = 0;
    }
  }
  if (value == 0) {
    return;
  }
  local_1a8 = *(limb *)(powers_of_ten_uint64 + value * 8);
  local_1a0 = num_local;
  local_1b0 = step;
  bigint::mul((bigint *)num_local,local_1a8);
  bigint::add((bigint *)local_1a0,local_1b0);
  return;
LAB_00679eeb:
  dVar7 = std::distance<char_const*>((char *)local_108,(char *)val_2);
  iVar4 = int_cmp_len<char>();
  if (dVar7 < iVar4) goto LAB_00679f79;
  uVar1 = *local_108;
  local_118 = uVar1;
  uVar8 = int_cmp_zeros<char>();
  if (uVar1 != uVar8) {
    local_f9 = true;
    goto LAB_00679fbc;
  }
  iVar4 = int_cmp_len<char>();
  local_108 = (uint64_t *)((long)local_108 + (long)iVar4);
  goto LAB_00679eeb;
LAB_00679f79:
  if (local_108 == (uint64_t *)val_2) goto LAB_00679fb5;
  if ((char)*local_108 != '0') {
    local_f9 = true;
    goto LAB_00679fbc;
  }
  local_108 = (uint64_t *)((long)local_108 + 1);
  goto LAB_00679f79;
LAB_0067a6ec:
  dVar7 = std::distance<char_const*>((char *)local_128,(char *)val_6);
  iVar4 = int_cmp_len<char>();
  if (dVar7 < iVar4) goto LAB_0067a77a;
  uVar1 = *local_128;
  local_138 = uVar1;
  uVar8 = int_cmp_zeros<char>();
  if (uVar1 != uVar8) {
    local_119 = '\x01';
    goto LAB_0067a7bd;
  }
  iVar4 = int_cmp_len<char>();
  local_128 = (uint64_t *)((long)local_128 + (long)iVar4);
  goto LAB_0067a6ec;
LAB_0067a77a:
  if (local_128 == (uint64_t *)val_6) {
    local_119 = '\0';
LAB_0067a7bd:
    if (local_119 != '\0') {
      local_c0 = num_local;
      local_c8 = (long *)counter;
      local_a8 = num_local;
      local_b0 = 10;
      local_b8 = 1;
      bigint::mul((bigint *)num_local,10);
      bigint::add((bigint *)local_a8,local_b8);
      *local_c8 = *local_c8 + 1;
    }
    return;
  }
  if ((char)*local_128 != '0') {
    local_119 = '\x01';
    goto LAB_0067a7bd;
  }
  local_128 = (uint64_t *)((long)local_128 + 1);
  goto LAB_0067a77a;
LAB_00679fb5:
  local_f9 = false;
LAB_00679fbc:
  bVar11 = local_f9;
  local_2a9 = local_f9;
  if (*(long *)(max_digits_local + 0x30) != 0) {
    puVar2 = *(uint64_t **)(max_digits_local + 0x30);
    local_f8.length = *(size_t *)(max_digits_local + 0x38);
    local_f8.ptr = (char *)puVar2;
    sVar5 = span<const_char>::len(&local_f8);
    val_3 = (long)puVar2 + sVar5;
    local_d8 = puVar2;
    while( true ) {
      dVar7 = std::distance<char_const*>((char *)local_d8,(char *)val_3);
      iVar4 = int_cmp_len<char>();
      if (dVar7 < iVar4) break;
      uVar1 = *local_d8;
      local_e8 = uVar1;
      uVar8 = int_cmp_zeros<char>();
      if (uVar1 != uVar8) {
        local_c9 = '\x01';
        goto LAB_0067a130;
      }
      iVar4 = int_cmp_len<char>();
      local_d8 = (uint64_t *)((long)local_d8 + (long)iVar4);
    }
    for (; local_d8 != (uint64_t *)val_3; local_d8 = (uint64_t *)((long)local_d8 + 1)) {
      if ((char)*local_d8 != '0') {
        local_c9 = '\x01';
        goto LAB_0067a130;
      }
    }
    local_c9 = '\0';
LAB_0067a130:
    local_2a9 = bVar11 != false || local_c9 != '\0';
  }
  if (local_2a9 == false) {
    return;
  }
  local_98 = num_local;
  local_a0 = (long *)counter;
  local_80 = num_local;
  local_88 = 10;
  local_90 = 1;
  bigint::mul((bigint *)num_local,10);
  bigint::add((bigint *)local_80,local_90);
  *local_a0 = *local_a0 + 1;
  return;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
void parse_mantissa(bigint& result, parsed_number_string_t<UC>& num, size_t max_digits, size_t& digits) noexcept {
  // try to minimize the number of big integer and scalar multiplication.
  // therefore, try to parse 8 digits at a time, and multiply by the largest
  // scalar value (9 or 19 digits) for each step.
  size_t counter = 0;
  digits = 0;
  limb value = 0;
#ifdef FASTFLOAT_64BIT_LIMB
  size_t step = 19;
#else
  size_t step = 9;
#endif

  // process all integer digits.
  UC const * p = num.integer.ptr;
  UC const * pend = p + num.integer.len();
  skip_zeros(p, pend);
  // process all digits, in increments of step per loop
  while (p != pend) {
    while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
      parse_eight_digits(p, value, counter, digits);
    }
    while (counter < step && p != pend && digits < max_digits) {
      parse_one_digit(p, value, counter, digits);
    }
    if (digits == max_digits) {
      // add the temporary value, then check if we've truncated any digits
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      bool truncated = is_truncated(p, pend);
      if (num.fraction.ptr != nullptr) {
        truncated |= is_truncated(num.fraction);
      }
      if (truncated) {
        round_up_bigint(result, digits);
      }
      return;
    } else {
      add_native(result, limb(powers_of_ten_uint64[counter]), value);
      counter = 0;
      value = 0;
    }
  }

  // add our fraction digits, if they're available.
  if (num.fraction.ptr != nullptr) {
    p = num.fraction.ptr;
    pend = p + num.fraction.len();
    if (digits == 0) {
      skip_zeros(p, pend);
    }
    // process all digits, in increments of step per loop
    while (p != pend) {
      while ((std::distance(p, pend) >= 8) && (step - counter >= 8) && (max_digits - digits >= 8)) {
        parse_eight_digits(p, value, counter, digits);
      }
      while (counter < step && p != pend && digits < max_digits) {
        parse_one_digit(p, value, counter, digits);
      }
      if (digits == max_digits) {
        // add the temporary value, then check if we've truncated any digits
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        bool truncated = is_truncated(p, pend);
        if (truncated) {
          round_up_bigint(result, digits);
        }
        return;
      } else {
        add_native(result, limb(powers_of_ten_uint64[counter]), value);
        counter = 0;
        value = 0;
      }
    }
  }

  if (counter != 0) {
    add_native(result, limb(powers_of_ten_uint64[counter]), value);
  }
}